

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::Api::_InternalSerialize(Api *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  SourceContext *value;
  Api *pAVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Syntax SVar5;
  uint32_t *puVar6;
  ulong uVar7;
  WireFormatLite *pWVar8;
  RepeatedPtrField<google::protobuf::Method> *this_00;
  const_reference this_01;
  RepeatedPtrField<google::protobuf::Option> *this_02;
  const_reference this_03;
  RepeatedPtrField<google::protobuf::Mixin> *this_04;
  const_reference this_05;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view sVar9;
  string_view field_name;
  Mixin *repfield_2;
  uint n_2;
  uint i_2;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  string *local_80;
  string *_s_1;
  Option *repfield_1;
  uint n_1;
  uint i_1;
  Method *repfield;
  uint n;
  uint i;
  char *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string *local_38;
  string *_s;
  Api *pAStack_28;
  uint32_t cached_has_bits;
  Api *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Api *this_local;
  
  _s._4_4_ = 0;
  pAStack_28 = this;
  this_ = (Api *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar6 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar6 & 1) != 0) {
    _internal_name_abi_cxx11_(pAStack_28);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      local_38 = _internal_name_abi_cxx11_(pAStack_28);
      pWVar8 = (WireFormatLite *)std::__cxx11::string::data();
      uVar3 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,"google.protobuf.Api.name");
      sVar9._M_str = in_R9;
      sVar9._M_len = (size_t)local_48._M_str;
      internal::WireFormatLite::VerifyUtf8String
                (pWVar8,(char *)(ulong)uVar3,1,(Operation)local_48._M_len,sVar9);
      pAVar1 = this_;
      _n = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38)
      ;
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)pAVar1,1,_n,(uint8_t *)stream_local);
    }
  }
  repfield._4_4_ = 0;
  repfield._0_4_ = _internal_methods_size(pAStack_28);
  for (; repfield._4_4_ < (uint)repfield; repfield._4_4_ = repfield._4_4_ + 1) {
    this_00 = _internal_methods(pAStack_28);
    this_01 = RepeatedPtrField<google::protobuf::Method>::Get(this_00,repfield._4_4_);
    _n_1 = this_01;
    iVar4 = Method::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_01,iVar4,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_1._4_4_ = 0;
  repfield_1._0_4_ = _internal_options_size(pAStack_28);
  for (; repfield_1._4_4_ < (uint)repfield_1; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    this_02 = _internal_options(pAStack_28);
    this_03 = RepeatedPtrField<google::protobuf::Option>::Get(this_02,repfield_1._4_4_);
    _s_1 = (string *)this_03;
    iVar4 = Option::GetCachedSize(this_03);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)this_03,iVar4,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  puVar6 = internal::HasBits<1>::operator[](&(pAStack_28->field_0)._impl_._has_bits_,0);
  if ((*puVar6 & 2) != 0) {
    _internal_version_abi_cxx11_(pAStack_28);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      local_80 = _internal_version_abi_cxx11_(pAStack_28);
      pWVar8 = (WireFormatLite *)std::__cxx11::string::data();
      uVar3 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_90,"google.protobuf.Api.version");
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)local_90._M_str;
      internal::WireFormatLite::VerifyUtf8String
                (pWVar8,(char *)(ulong)uVar3,1,(Operation)local_90._M_len,field_name);
      pAVar1 = this_;
      sVar9 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)pAVar1,4,sVar9,(uint8_t *)stream_local);
    }
  }
  puVar6 = internal::HasBits<1>::operator[](&(pAStack_28->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar6;
  if ((_s._4_4_ & 4) != 0) {
    value = (pAStack_28->field_0)._impl_.source_context_;
    iVar4 = SourceContext::GetCachedSize((pAStack_28->field_0)._impl_.source_context_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)value,iVar4,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_2._4_4_ = 0;
  uVar3 = _internal_mixins_size(pAStack_28);
  for (; repfield_2._4_4_ < uVar3; repfield_2._4_4_ = repfield_2._4_4_ + 1) {
    this_04 = _internal_mixins(pAStack_28);
    this_05 = RepeatedPtrField<google::protobuf::Mixin>::Get(this_04,repfield_2._4_4_);
    iVar4 = Mixin::GetCachedSize(this_05);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (6,(MessageLite *)this_05,iVar4,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 8) != 0) {
    SVar5 = _internal_syntax(pAStack_28);
    if (SVar5 != SYNTAX_PROTO2) {
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::EnsureSpace
                               ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
      SVar5 = _internal_syntax(pAStack_28);
      stream_local = (EpsCopyOutputStream *)
                     internal::WireFormatLite::WriteEnumToArray(7,SVar5,(uint8_t *)stream_local);
    }
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(pAStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pAStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Api::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Api& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Api)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // string name = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._internal_name().empty()) {
      const ::std::string& _s = this_._internal_name();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Api.name");
      target = stream->WriteStringMaybeAliased(1, _s, target);
    }
  }

  // repeated .google.protobuf.Method methods = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_methods_size());
       i < n; i++) {
    const auto& repfield = this_._internal_methods().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Option options = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_options_size());
       i < n; i++) {
    const auto& repfield = this_._internal_options().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // string version = 4;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._internal_version().empty()) {
      const ::std::string& _s = this_._internal_version();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Api.version");
      target = stream->WriteStringMaybeAliased(4, _s, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // .google.protobuf.SourceContext source_context = 5;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.source_context_, this_._impl_.source_context_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.Mixin mixins = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_mixins_size());
       i < n; i++) {
    const auto& repfield = this_._internal_mixins().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // .google.protobuf.Syntax syntax = 7;
  if ((cached_has_bits & 0x00000008u) != 0) {
    if (this_._internal_syntax() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          7, this_._internal_syntax(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Api)
  return target;
}